

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

int32_t icu_63::MeasureUnit::getAvailable
                  (char *type,MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar7 = 0;
  iVar8 = 0x14;
  do {
    while( true ) {
      if (iVar8 <= iVar7) {
        return 0;
      }
      iVar1 = iVar7 + iVar8;
      iVar6 = iVar1 / 2;
      lVar9 = (long)iVar6;
      iVar2 = strcmp(*(char **)(gTypes + lVar9 * 8),type);
      if (-1 < iVar2) break;
      iVar7 = iVar6 + 1;
    }
    iVar8 = iVar6;
  } while (iVar2 != 0);
  uVar3 = 0;
  if (1 < iVar1 + 3U) {
    uVar3 = *(int *)(&DAT_003334b4 + lVar9 * 4) - (&gOffsets)[lVar9];
    if (destCapacity < (int)uVar3) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else if (0 < (int)uVar3) {
      pcVar5 = dest->fCurrency;
      uVar4 = 0;
      do {
        *(int *)(pcVar5 + -8) = iVar6;
        *(int32_t *)(pcVar5 + -4) = (int32_t)uVar4;
        *pcVar5 = '\0';
        uVar4 = uVar4 + 1;
        pcVar5 = pcVar5 + 0x18;
      } while (uVar3 != uVar4);
    }
  }
  return uVar3;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        const char *type,
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t typeIdx = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (typeIdx == -1) {
        return 0;
    }
    int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
    if (destCapacity < len) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return len;
    }
    for (int subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
        dest[subTypeIdx].setTo(typeIdx, subTypeIdx);
    }
    return len;
}